

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpCrashHandler.c
# Opt level: O2

qpCrashHandler * qpCrashHandler_create(qpCrashHandlerFunc handlerFunc,void *userPointer)

{
  qpCrashHandler *pqVar1;
  code *pcVar2;
  long lVar3;
  sigaction *__oact;
  sigaction action;
  sigaction local_c0;
  
  pqVar1 = (qpCrashHandler *)deCalloc(0x3c8);
  if (pqVar1 != (qpCrashHandler *)0x0) {
    pcVar2 = defaultCrashHandler;
    if (handlerFunc != (qpCrashHandlerFunc)0x0) {
      pcVar2 = handlerFunc;
    }
    pqVar1->crashHandlerFunc = pcVar2;
    pqVar1->handlerUserPointer = userPointer;
    (pqVar1->crashInfo).type = QP_CRASHTYPE_LAST;
    (pqVar1->crashInfo).message = (char *)0x0;
    (pqVar1->crashInfo).file = (char *)0x0;
    (pqVar1->crashInfo).line = 0;
    g_crashHandler = pqVar1;
    deSetAssertFailureCallback(assertFailureCallback);
    sigemptyset(&local_c0.sa_mask);
    local_c0.__sigaction_handler.sa_handler = signalHandler;
    local_c0.sa_flags = 0;
    __oact = (sigaction *)pqVar1->oldHandlers;
    for (lVar3 = 0; lVar3 != 0x60; lVar3 = lVar3 + 0x10) {
      sigaction(*(int *)((long)&s_signals[0].signalNum + lVar3),&local_c0,__oact);
      __oact = __oact + 1;
    }
  }
  return pqVar1;
}

Assistant:

qpCrashHandler* qpCrashHandler_create (qpCrashHandlerFunc handlerFunc, void* userPointer)
{
	/* Allocate & initialize. */
	qpCrashHandler* handler = (qpCrashHandler*)deCalloc(sizeof(qpCrashHandler));
	DBGPRINT(("qpCrashHandler::create()\n"));
	if (!handler)
		return handler;

	DE_ASSERT(g_crashHandler == DE_NULL);

	handler->crashHandlerFunc	= handlerFunc ? handlerFunc : defaultCrashHandler;
	handler->handlerUserPointer	= userPointer;

	qpCrashInfo_init(&handler->crashInfo);

	g_crashHandler = handler;

	/* DE_ASSERT callback. */
	deSetAssertFailureCallback(assertFailureCallback);

#if defined(QP_USE_SIGNAL_HANDLER)
	/* Register signal handlers. */
	{
		struct sigaction	action;
		int					sigNdx;

		sigemptyset(&action.sa_mask);
		action.sa_handler	= signalHandler;
		action.sa_flags		= 0;

		for (sigNdx = 0; sigNdx < DE_LENGTH_OF_ARRAY(s_signals); sigNdx++)
			sigaction(s_signals[sigNdx].signalNum, &action, &handler->oldHandlers[sigNdx]);
	}
#endif

	return handler;
}